

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np2_opna.cpp
# Opt level: O3

void __thiscall NP2OPNA<FM::OPNB>::setRate(NP2OPNA<FM::OPNB> *this,uint32_t rate,uint32_t clock)

{
  int32_t *piVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint r;
  
  uVar2 = (this->super_OPNChipBaseBufferedT<NP2OPNA<FM::OPNB>,_256U>).
          super_OPNChipBaseT<NP2OPNA<FM::OPNB>_>.super_OPNChipBase.m_rate;
  uVar3 = (this->super_OPNChipBaseBufferedT<NP2OPNA<FM::OPNB>,_256U>).
          super_OPNChipBaseT<NP2OPNA<FM::OPNB>_>.super_OPNChipBase.m_clock;
  (this->super_OPNChipBaseBufferedT<NP2OPNA<FM::OPNB>,_256U>).super_OPNChipBaseT<NP2OPNA<FM::OPNB>_>
  .super_OPNChipBase.m_rate = rate;
  (this->super_OPNChipBaseBufferedT<NP2OPNA<FM::OPNB>,_256U>).super_OPNChipBaseT<NP2OPNA<FM::OPNB>_>
  .super_OPNChipBase.m_clock = clock;
  piVar1 = (this->super_OPNChipBaseBufferedT<NP2OPNA<FM::OPNB>,_256U>).
           super_OPNChipBaseT<NP2OPNA<FM::OPNB>_>.m_oldsamples;
  if ((uVar2 == rate) && (uVar3 == clock)) {
    piVar1[0] = 0;
    piVar1[1] = 0;
    (this->super_OPNChipBaseBufferedT<NP2OPNA<FM::OPNB>,_256U>).
    super_OPNChipBaseT<NP2OPNA<FM::OPNB>_>.m_samples[0] = 0;
    (this->super_OPNChipBaseBufferedT<NP2OPNA<FM::OPNB>,_256U>).
    super_OPNChipBaseT<NP2OPNA<FM::OPNB>_>.m_samples[1] = 0;
    (this->super_OPNChipBaseBufferedT<NP2OPNA<FM::OPNB>,_256U>).
    super_OPNChipBaseT<NP2OPNA<FM::OPNB>_>.m_samplecnt = 0;
  }
  else {
    piVar1[0] = 0;
    piVar1[1] = 0;
    (this->super_OPNChipBaseBufferedT<NP2OPNA<FM::OPNB>,_256U>).
    super_OPNChipBaseT<NP2OPNA<FM::OPNB>_>.m_samples[0] = 0;
    (this->super_OPNChipBaseBufferedT<NP2OPNA<FM::OPNB>,_256U>).
    super_OPNChipBaseT<NP2OPNA<FM::OPNB>_>.m_samples[1] = 0;
    (this->super_OPNChipBaseBufferedT<NP2OPNA<FM::OPNB>,_256U>).
    super_OPNChipBaseT<NP2OPNA<FM::OPNB>_>.m_samplecnt = 0;
    (this->super_OPNChipBaseBufferedT<NP2OPNA<FM::OPNB>,_256U>).
    super_OPNChipBaseT<NP2OPNA<FM::OPNB>_>.m_rateratio =
         (int32_t)(((ulong)rate * 0x24000) / (ulong)clock);
  }
  r = 0xd013;
  if ((this->super_OPNChipBaseBufferedT<NP2OPNA<FM::OPNB>,_256U>).
      super_OPNChipBaseT<NP2OPNA<FM::OPNB>_>.super_OPNChipBase.m_family == OPNChip_OPNA) {
    r = 0xd8aa;
  }
  if ((this->super_OPNChipBaseBufferedT<NP2OPNA<FM::OPNB>,_256U>).
      super_OPNChipBaseT<NP2OPNA<FM::OPNB>_>.m_runningAtPcmRate != false) {
    r = rate;
  }
  FM::OPNB::SetRate(this->chip,clock,r,false);
  FM::OPNB::SetReg(this->chip,0x29,0x9f);
  return;
}

Assistant:

void NP2OPNA<ChipType>::setRate(uint32_t rate, uint32_t clock)
{
    ChipBase::setRate(rate, clock);
    uint32_t chipRate = ChipBase::isRunningAtPcmRate() ? rate : ChipBase::nativeRate();
    chip->SetRate(clock, chipRate, false);  // implies Reset()
    chip->SetReg(0x29, 0x9f);  // enable channels 4-6
}